

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QWizardField>::emplace<QWizardField_const&>
          (QMovableArrayOps<QWizardField> *this,qsizetype i,QWizardField *args)

{
  QWizardField **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QWizardField *pQVar4;
  QWizardField *pQVar5;
  Data *pDVar6;
  Data *pDVar7;
  QObject *pQVar8;
  undefined7 uVar9;
  QArrayData *pQVar10;
  char16_t *pcVar11;
  qsizetype qVar12;
  QArrayData *pQVar13;
  char *pcVar14;
  qsizetype qVar15;
  QArrayData *pQVar16;
  char *pcVar17;
  qsizetype qVar18;
  QWizardField *__dest;
  long in_FS_OFFSET;
  bool bVar19;
  Inserter local_e0;
  QWizardPage *local_b8;
  QArrayData *local_b0;
  char16_t *local_a8;
  qsizetype local_a0;
  undefined8 local_98;
  QObject *pQStack_90;
  QArrayData *local_88;
  char *pcStack_80;
  qsizetype local_78;
  QArrayData *pQStack_70;
  char *local_68;
  qsizetype qStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00512c32:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = args->page;
    local_b0 = &((args->name).d.d)->super_QArrayData;
    local_a8 = (args->name).d.ptr;
    local_a0 = (args->name).d.size;
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (((Data *)local_b0)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_b0)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_98 = *(undefined8 *)&args->mandatory;
    pQStack_90 = args->object;
    local_88 = &((args->property).d.d)->super_QArrayData;
    pcStack_80 = (args->property).d.ptr;
    local_78 = (args->property).d.size;
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (((Data *)local_88)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_88)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQStack_70 = &((args->changedSignal).d.d)->super_QArrayData;
    local_68 = (args->changedSignal).d.ptr;
    qStack_60 = (args->changedSignal).d.size;
    if (pQStack_70 != (QArrayData *)0x0) {
      LOCK();
      (((Data *)pQStack_70)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)pQStack_70)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    ::QVariant::QVariant((QVariant *)&local_58,&args->initialValue);
    bVar19 = (this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.size
             != 0;
    QArrayDataPointer<QWizardField>::detachAndGrow
              ((QArrayDataPointer<QWizardField> *)this,(uint)(i == 0 && bVar19),1,
               (QWizardField **)0x0,(QArrayDataPointer<QWizardField> *)0x0);
    qVar18 = qStack_60;
    pcVar17 = local_68;
    pQVar16 = pQStack_70;
    qVar15 = local_78;
    pcVar14 = pcStack_80;
    pQVar13 = local_88;
    qVar12 = local_a0;
    pcVar11 = local_a8;
    pQVar10 = local_b0;
    if (i == 0 && bVar19) {
      pQVar4 = (this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.
               ptr;
      pQVar4[-1].page = local_b8;
      local_b0 = (QArrayData *)0x0;
      pQVar4[-1].name.d.d = (Data *)pQVar10;
      local_a8 = (char16_t *)0x0;
      pQVar4[-1].name.d.ptr = pcVar11;
      local_a0 = 0;
      pQVar4[-1].name.d.size = qVar12;
      *(undefined8 *)&pQVar4[-1].mandatory = local_98;
      pQVar4[-1].object = pQStack_90;
      local_88 = (QArrayData *)0x0;
      pQVar4[-1].property.d.d = (Data *)pQVar13;
      pcStack_80 = (char *)0x0;
      pQVar4[-1].property.d.ptr = pcVar14;
      local_78 = 0;
      pQVar4[-1].property.d.size = qVar15;
      pQStack_70 = (QArrayData *)0x0;
      pQVar4[-1].changedSignal.d.d = (Data *)pQVar16;
      local_68 = (char *)0x0;
      pQVar4[-1].changedSignal.d.ptr = pcVar17;
      qStack_60 = 0;
      pQVar4[-1].changedSignal.d.size = qVar18;
      *(undefined8 *)((long)&pQVar4[-1].initialValue.d.data + 0x10) = local_58._16_8_;
      *(undefined1 **)&pQVar4[-1].initialValue.d.field_0x18 = puStack_40;
      pQVar4[-1].initialValue.d.data.shared = local_58.shared;
      *(undefined8 *)((long)&pQVar4[-1].initialValue.d.data + 8) = local_58._8_8_;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      puStack_40 = (undefined1 *)0x2;
      ppQVar1 = &(this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.
                 ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.
                size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pQVar5 = (this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.
               ptr;
      pQVar4 = pQVar5 + i;
      __dest = pQVar4 + 1;
      local_e0.nInserts = 1;
      local_e0.bytes =
           ((this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.size
           - i) * 0x80;
      local_e0.data = (QArrayDataPointer<QWizardField> *)this;
      local_e0.displaceTo = __dest;
      memmove(__dest,pQVar5 + i,local_e0.bytes);
      qVar18 = qStack_60;
      pcVar17 = local_68;
      pQVar16 = pQStack_70;
      qVar15 = local_78;
      pcVar14 = pcStack_80;
      pQVar13 = local_88;
      qVar12 = local_a0;
      pcVar11 = local_a8;
      pQVar10 = local_b0;
      pQVar4->page = local_b8;
      local_b0 = (QArrayData *)0x0;
      (pQVar4->name).d.d = (Data *)pQVar10;
      local_a8 = (char16_t *)0x0;
      (pQVar4->name).d.ptr = pcVar11;
      local_a0 = 0;
      (pQVar4->name).d.size = qVar12;
      *(undefined8 *)&pQVar4->mandatory = local_98;
      pQVar4->object = pQStack_90;
      local_88 = (QArrayData *)0x0;
      (pQVar4->property).d.d = (Data *)pQVar13;
      pcStack_80 = (char *)0x0;
      (pQVar4->property).d.ptr = pcVar14;
      local_78 = 0;
      (pQVar4->property).d.size = qVar15;
      pQStack_70 = (QArrayData *)0x0;
      (pQVar4->changedSignal).d.d = (Data *)pQVar16;
      local_68 = (char *)0x0;
      (pQVar4->changedSignal).d.ptr = pcVar17;
      qStack_60 = 0;
      (pQVar4->changedSignal).d.size = qVar18;
      *(undefined8 *)((long)&(pQVar4->initialValue).d.data + 0x10) = local_58._16_8_;
      *(undefined1 **)&(pQVar4->initialValue).d.field_0x18 = puStack_40;
      (pQVar4->initialValue).d.data.shared = local_58.shared;
      *(undefined8 *)((long)&(pQVar4->initialValue).d.data + 8) = local_58._8_8_;
      local_58._16_8_ = 0;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      puStack_40 = (undefined1 *)0x2;
      local_e0.displaceFrom = __dest;
      Inserter::~Inserter(&local_e0);
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (pQStack_70 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_70,1,0x10);
      }
    }
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,1,0x10);
      }
    }
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0,2,0x10);
      }
    }
  }
  else {
    if (((this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.size ==
         i) && (pQVar4 = (this->super_QGenericArrayOps<QWizardField>).
                         super_QArrayDataPointer<QWizardField>.ptr,
               (pDVar3->super_QArrayData).alloc !=
               ((long)((long)pQVar4 -
                      ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 7) + i)) {
      pQVar4[i].page = args->page;
      pDVar6 = (args->name).d.d;
      pQVar4[i].name.d.d = pDVar6;
      pQVar4[i].name.d.ptr = (args->name).d.ptr;
      pQVar4[i].name.d.size = (args->name).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      uVar9 = *(undefined7 *)&args->field_0x21;
      pQVar8 = args->object;
      pQVar4[i].mandatory = args->mandatory;
      *(undefined7 *)&pQVar4[i].field_0x21 = uVar9;
      pQVar4[i].object = pQVar8;
      pDVar7 = (args->property).d.d;
      pQVar4[i].property.d.d = pDVar7;
      pQVar4[i].property.d.ptr = (args->property).d.ptr;
      pQVar4[i].property.d.size = (args->property).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar7 = (args->changedSignal).d.d;
      pQVar4[i].changedSignal.d.d = pDVar7;
      pQVar4[i].changedSignal.d.ptr = (args->changedSignal).d.ptr;
      pQVar4[i].changedSignal.d.size = (args->changedSignal).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ::QVariant::QVariant(&pQVar4[i].initialValue,&args->initialValue);
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QGenericArrayOps<QWizardField>).
                   super_QArrayDataPointer<QWizardField>.ptr,
         (QWizardField *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar4))
      goto LAB_00512c32;
      pQVar4[-1].page = args->page;
      pDVar6 = (args->name).d.d;
      pQVar4[-1].name.d.d = pDVar6;
      pQVar4[-1].name.d.ptr = (args->name).d.ptr;
      pQVar4[-1].name.d.size = (args->name).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      uVar9 = *(undefined7 *)&args->field_0x21;
      pQVar8 = args->object;
      pQVar4[-1].mandatory = args->mandatory;
      *(undefined7 *)&pQVar4[-1].field_0x21 = uVar9;
      pQVar4[-1].object = pQVar8;
      pDVar7 = (args->property).d.d;
      pQVar4[-1].property.d.d = pDVar7;
      pQVar4[-1].property.d.ptr = (args->property).d.ptr;
      pQVar4[-1].property.d.size = (args->property).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar7 = (args->changedSignal).d.d;
      pQVar4[-1].changedSignal.d.d = pDVar7;
      pQVar4[-1].changedSignal.d.ptr = (args->changedSignal).d.ptr;
      pQVar4[-1].changedSignal.d.size = (args->changedSignal).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ::QVariant::QVariant(&pQVar4[-1].initialValue,&args->initialValue);
      ppQVar1 = &(this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.
                 ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QWizardField>).super_QArrayDataPointer<QWizardField>.
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }